

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyInsertNodeAtEnd(Node *element,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  node->parent = element;
  pNVar1 = element->last;
  node->prev = pNVar1;
  ppNVar2 = &pNVar1->next;
  if (pNVar1 == (Node *)0x0) {
    ppNVar2 = &element->content;
  }
  *ppNVar2 = node;
  element->last = node;
  return;
}

Assistant:

void TY_(InsertNodeAtEnd)(Node *element, Node *node)
{
    node->parent = element;
    node->prev = element->last;

    if (element->last != NULL)
        element->last->next = node;
    else
        element->content = node;

    element->last = node;
}